

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::fuzz<capnp::_::(anonymous_namespace)::TextChecker>
          (anon_unknown_0 *this,ArrayPtr<capnp::word> data,uint flipCount,uint startAt,uint endAt)

{
  byte bVar1;
  uchar uVar2;
  uchar *puVar3;
  byte *pbVar4;
  ArrayPtr<const_capnp::word> data_00;
  ArrayPtr<capnp::word> data_01;
  ArrayPtr<capnp::word> data_02;
  ArrayPtr<capnp::word> data_03;
  ArrayPtr<unsigned_char> local_c0;
  anon_unknown_0 *local_b0;
  word *local_a8;
  ArrayPtr<unsigned_char> local_a0;
  anon_unknown_0 *local_90;
  word *local_88;
  ArrayPtr<unsigned_char> local_80;
  anon_unknown_0 *local_70;
  word *local_68;
  ArrayPtr<unsigned_char> local_60;
  ArrayPtr<unsigned_char> local_50;
  uchar local_3e;
  byte local_3d;
  uint local_3c;
  undefined1 auStack_38 [2];
  byte old;
  byte bit;
  uint i;
  uint local_24;
  uint local_20;
  uint endAt_local;
  uint startAt_local;
  uint flipCount_local;
  ArrayPtr<capnp::word> data_local;
  
  data_local.ptr = data.ptr;
  endAt_local = (uint)data.size_;
  local_3c = flipCount;
  local_24 = startAt;
  local_20 = flipCount;
  _startAt_local = this;
  if (endAt_local == 0) {
    _auStack_38 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&startAt_local);
    data_00.size_ = (word *)auStack_38._8_8_;
    data_00.ptr = data_00.size_;
    traverseCatchingExceptions<capnp::_::(anonymous_namespace)::TextChecker>(_auStack_38,data_00);
  }
  else {
    for (; local_3c < local_24; local_3c = local_3c + 1) {
      local_3d = (byte)(1 << ((byte)local_3c & 7));
      local_50 = kj::ArrayPtr<capnp::word>::asBytes((ArrayPtr<capnp::word> *)&startAt_local);
      puVar3 = kj::ArrayPtr<unsigned_char>::operator[](&local_50,(ulong)(local_3c >> 3));
      bVar1 = local_3d;
      local_3e = *puVar3;
      local_60 = kj::ArrayPtr<capnp::word>::asBytes((ArrayPtr<capnp::word> *)&startAt_local);
      pbVar4 = kj::ArrayPtr<unsigned_char>::operator[](&local_60,(ulong)(local_3c >> 3));
      *pbVar4 = *pbVar4 | bVar1;
      local_70 = _startAt_local;
      local_68 = data_local.ptr;
      data_01.size_._0_4_ = endAt_local - 1;
      data_01.ptr = data_local.ptr;
      data_01.size_._4_4_ = 0;
      fuzz<capnp::_::(anonymous_namespace)::TextChecker>
                (_startAt_local,data_01,local_3c + 1,local_24,endAt);
      bVar1 = local_3d ^ 0xff;
      local_80 = kj::ArrayPtr<capnp::word>::asBytes((ArrayPtr<capnp::word> *)&startAt_local);
      pbVar4 = kj::ArrayPtr<unsigned_char>::operator[](&local_80,(ulong)(local_3c >> 3));
      *pbVar4 = *pbVar4 & bVar1;
      local_90 = _startAt_local;
      local_88 = data_local.ptr;
      data_02.size_._0_4_ = endAt_local - 1;
      data_02.ptr = data_local.ptr;
      data_02.size_._4_4_ = 0;
      fuzz<capnp::_::(anonymous_namespace)::TextChecker>
                (_startAt_local,data_02,local_3c + 1,local_24,endAt);
      bVar1 = local_3d;
      local_a0 = kj::ArrayPtr<capnp::word>::asBytes((ArrayPtr<capnp::word> *)&startAt_local);
      pbVar4 = kj::ArrayPtr<unsigned_char>::operator[](&local_a0,(ulong)(local_3c >> 3));
      *pbVar4 = bVar1;
      local_b0 = _startAt_local;
      local_a8 = data_local.ptr;
      data_03.size_._0_4_ = endAt_local - 1;
      data_03.ptr = data_local.ptr;
      data_03.size_._4_4_ = 0;
      fuzz<capnp::_::(anonymous_namespace)::TextChecker>
                (_startAt_local,data_03,local_3c + 1,local_24,endAt);
      uVar2 = local_3e;
      local_c0 = kj::ArrayPtr<capnp::word>::asBytes((ArrayPtr<capnp::word> *)&startAt_local);
      puVar3 = kj::ArrayPtr<unsigned_char>::operator[](&local_c0,(ulong)(local_3c >> 3));
      *puVar3 = uVar2;
    }
  }
  return;
}

Assistant:

void fuzz(kj::ArrayPtr<word> data, uint flipCount, uint startAt, uint endAt) {
  if (flipCount == 0) {
    traverseCatchingExceptions<Checker>(data);
  } else {
    for (uint i = startAt; i < endAt; i++) {
      byte bit = 1u << (i % 8);
      byte old = data.asBytes()[i / 8];
      data.asBytes()[i / 8] |= bit;
      fuzz<Checker>(data, flipCount - 1, i + 1, endAt);
      data.asBytes()[i / 8] &= ~bit;
      fuzz<Checker>(data, flipCount - 1, i + 1, endAt);
      data.asBytes()[i / 8] = bit;
      fuzz<Checker>(data, flipCount - 1, i + 1, endAt);
      data.asBytes()[i / 8] = old;
    }
  }
}